

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::CreateScriptContext_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  TTDCreateJsRTContextCallback p_Var1;
  JsRTCreateScriptContextAction *pJVar2;
  void *pvVar3;
  ScriptContext *local_30;
  ScriptContext *resCtx;
  
  pJVar2 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTCreateScriptContextAction,(TTD::NSLogEvents::EventKind)17>
                     (evt);
  local_30 = (ScriptContext *)0x0;
  p_Var1 = (executeContext->TTDExternalObjectFunctions).pfCreateJsRTContextCallback;
  pvVar3 = ThreadContextTTD::GetRuntimeHandle(executeContext);
  (*p_Var1)(pvVar3,&local_30);
  if (local_30 != (ScriptContext *)0x0) {
    ThreadContextTTD::AddRootRef_Replay
              (executeContext,pJVar2->GlobalObject,
               (RecyclableObject *)(local_30->super_ScriptContextBase).globalObject);
    local_30->ScriptContextLogTag = pJVar2->GlobalObject;
    ThreadContextTTD::AddRootRef_Replay
              (executeContext,pJVar2->KnownObjects->UndefinedObject,
               (((local_30->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase
               ).undefinedValue.ptr);
    ThreadContextTTD::AddRootRef_Replay
              (executeContext,pJVar2->KnownObjects->NullObject,
               (((local_30->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase
               ).nullValue.ptr);
    ThreadContextTTD::AddRootRef_Replay
              (executeContext,pJVar2->KnownObjects->TrueObject,
               &((((local_30->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).booleanTrue.ptr)->super_RecyclableObject);
    ThreadContextTTD::AddRootRef_Replay
              (executeContext,pJVar2->KnownObjects->FalseObject,
               &((((local_30->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).booleanFalse.ptr)->super_RecyclableObject);
    return;
  }
  TTDAbort_unrecoverable_error("Create failed");
}

Assistant:

void CreateScriptContext_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            const JsRTCreateScriptContextAction* cAction = GetInlineEventDataAs<JsRTCreateScriptContextAction, EventKind::CreateScriptContextActionTag>(evt);

            Js::ScriptContext* resCtx = nullptr;
            executeContext->TTDExternalObjectFunctions.pfCreateJsRTContextCallback(executeContext->GetRuntimeHandle(), &resCtx);
            TTDAssert(resCtx != nullptr, "Create failed");

            executeContext->AddRootRef_Replay(cAction->GlobalObject, resCtx->GetGlobalObject());
            resCtx->ScriptContextLogTag = cAction->GlobalObject;

            executeContext->AddRootRef_Replay(cAction->KnownObjects->UndefinedObject, resCtx->GetLibrary()->GetUndefined());
            executeContext->AddRootRef_Replay(cAction->KnownObjects->NullObject, resCtx->GetLibrary()->GetNull());
            executeContext->AddRootRef_Replay(cAction->KnownObjects->TrueObject, resCtx->GetLibrary()->GetTrue());
            executeContext->AddRootRef_Replay(cAction->KnownObjects->FalseObject, resCtx->GetLibrary()->GetFalse());
        }